

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O3

float v_scroll_percent_visible_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar3;
  Am_Object group;
  Am_Object local_20;
  undefined1 local_18 [16];
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  pAVar1 = Am_Object::Get(&local_20,399,0);
  local_18._0_4_ = Am_Value::operator_cast_to_float(pAVar1);
  local_18._4_4_ = extraout_XMM0_Db;
  local_18._8_4_ = extraout_XMM0_Dc;
  local_18._12_4_ = extraout_XMM0_Dd;
  pAVar1 = Am_Object::Get(&local_20,0x1c2,0);
  fVar2 = Am_Value::operator_cast_to_float(pAVar1);
  fVar2 = fVar2 / (float)(~-(uint)((float)local_18._0_4_ == 0.0) & local_18._0_4_ |
                         -(uint)((float)local_18._0_4_ == 0.0) & 0x3f800000);
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  local_18 = ZEXT416((uint)fVar3);
  Am_Object::~Am_Object(&local_20);
  return (float)local_18._0_4_;
}

Assistant:

Am_Define_Formula(float, v_scroll_percent_visible)
{
  Am_Object group = self.Get_Owner();
  float innerh = group.Get(Am_INNER_HEIGHT);
  if (innerh == 0.0f)
    innerh = 1.0f;
  float val = (float)group.Get(Am_CLIP_HEIGHT) / innerh;
  if (val > 1.0)
    val = 1.0f;
  return val;
}